

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O3

void __thiscall
Equality_unitsEqualDifferingOrderOfUnitsManyUnit_Test::TestBody
          (Equality_unitsEqualDifferingOrderOfUnitsManyUnit_Test *this)

{
  string *psVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  UnitsPtr u2;
  UnitsPtr u1;
  AssertionResult local_a8;
  long local_98 [2];
  long *local_88;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  long local_78 [2];
  AssertHelper local_68 [8];
  string *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  string *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  long *local_40 [2];
  long local_30 [2];
  
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"unitsA","");
  libcellml::Units::create((string *)&local_50);
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"unitsA","");
  libcellml::Units::create((string *)&local_60);
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_50;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"second","");
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"unit_id","");
  libcellml::Units::addUnit(psVar1,1.0,(string *)&local_a8);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_50;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"metre","");
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  libcellml::Units::addUnit(psVar1,3.0,(string *)&local_a8);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_50;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"apple","");
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  libcellml::Units::addUnit(psVar1,1.0,(string *)&local_a8);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_50;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"jedi","");
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"yota","");
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"");
  libcellml::Units::addUnit(psVar1,(string *)&local_a8,-2.0,1.0,(string *)&local_88);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_50;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"flip","");
  libcellml::Units::addUnit(psVar1);
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_50;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"lumen","");
  libcellml::Units::addUnit(psVar1);
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_60;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"jedi","");
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"yota","");
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"");
  libcellml::Units::addUnit(psVar1,(string *)&local_a8,-2.0,1.0,(string *)&local_88);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_60;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"second","");
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"unit_id","");
  libcellml::Units::addUnit(psVar1,1.0,(string *)&local_a8);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_60;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"lumen","");
  libcellml::Units::addUnit(psVar1);
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_60;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"metre","");
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  libcellml::Units::addUnit(psVar1,3.0,(string *)&local_a8);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_60;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"apple","");
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  libcellml::Units::addUnit(psVar1,1.0,(string *)&local_a8);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_60;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"flip","");
  libcellml::Units::addUnit(psVar1);
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  local_a8._0_8_ = local_60;
  local_a8.message_.ptr_ = local_58;
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_58->_M_string_length = (int)local_58->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_58->_M_string_length = (int)local_58->_M_string_length + 1;
    }
  }
  cVar2 = libcellml::Entity::equals((shared_ptr *)local_50);
  local_88 = (long *)CONCAT71(local_88._1_7_,cVar2);
  local_80.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_a8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (cVar2 == '\0') goto LAB_0011682f;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.message_.ptr_);
    if (((ulong)local_88 & 1) == 0) {
LAB_0011682f:
      testing::Message::Message((Message *)local_40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,(char *)&local_88,"u1->equals(u2)","false");
      testing::internal::AssertHelper::AssertHelper
                (local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
                 ,0x146,(char *)local_a8._0_8_);
      testing::internal::AssertHelper::operator=(local_68,(Message *)local_40);
      testing::internal::AssertHelper::~AssertHelper(local_68);
      if ((string *)local_a8._0_8_ != (string *)local_98) {
        operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
      }
      if (((local_40[0] != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0'))
         && (local_40[0] != (long *)0x0)) {
        (**(code **)(*local_40[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8._0_8_ = local_50;
  local_a8.message_.ptr_ = local_48;
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_48->_M_string_length = (int)local_48->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_48->_M_string_length = (int)local_48->_M_string_length + 1;
    }
  }
  cVar2 = libcellml::Entity::equals((shared_ptr *)local_60);
  local_88 = (long *)CONCAT71(local_88._1_7_,cVar2);
  local_80.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_a8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (cVar2 != '\0') goto LAB_001169e5;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.message_.ptr_);
    if (((ulong)local_88 & 1) != 0) goto LAB_001169e5;
  }
  testing::Message::Message((Message *)local_40);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_a8,(char *)&local_88,"u2->equals(u1)","false");
  testing::internal::AssertHelper::AssertHelper
            (local_68,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
             ,0x147,(char *)local_a8._0_8_);
  testing::internal::AssertHelper::operator=(local_68,(Message *)local_40);
  testing::internal::AssertHelper::~AssertHelper(local_68);
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  if (((local_40[0] != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
     (local_40[0] != (long *)0x0)) {
    (**(code **)(*local_40[0] + 8))();
  }
LAB_001169e5:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58);
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
  }
  return;
}

Assistant:

TEST(Equality, unitsNotEqualByUnitIdOnly)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second");
    u2->addUnit("second");

    u1->setUnitId(0, "UnitsASecond");

    EXPECT_NE(u1, u2);
    EXPECT_FALSE(u1->equals(u2));
    EXPECT_FALSE(u2->equals(u1));
    EXPECT_TRUE(libcellml::Units::equivalent(u1, u2));
}